

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_rule.h
# Opt level: O1

void __thiscall
re2c::RuleOp::RuleOp(RuleOp *this,Loc *l,RegExp *r1,RegExp *r2,rule_rank_t r,Code *c,string *cond)

{
  pointer pcVar1;
  RuleOp *local_38;
  
  (this->super_RegExp)._vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
  local_38 = this;
  std::
  _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
  ::_M_insert_unique<re2c::RegExp*>
            ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
              *)RegExp::vFreeList,(RegExp **)&local_38);
  (this->super_RegExp)._vptr_RegExp = (_func_int **)&PTR__RuleOp_0015ccb0;
  (this->loc).filename._M_dataplus._M_p = (pointer)&(this->loc).filename.field_2;
  pcVar1 = (l->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->loc,pcVar1,pcVar1 + (l->filename)._M_string_length);
  (this->loc).line = l->line;
  this->exp = r1;
  this->ctx = r2;
  (this->rank).value = r.value;
  this->code = c;
  (this->newcond)._M_dataplus._M_p = (pointer)&(this->newcond).field_2;
  if (cond == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->newcond,"");
  }
  else {
    pcVar1 = (cond->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->newcond,pcVar1,pcVar1 + cond->_M_string_length);
  }
  return;
}

Assistant:

inline RuleOp
		( const Loc & l
		, RegExp * r1
		, RegExp * r2
		, rule_rank_t r
		, const Code * c
		, const std::string * cond
		)
		: loc (l)
		, exp (r1)
		, ctx (r2)
		, rank (r)
		, code (c)
		, newcond (cond ? *cond : "")
	{}